

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O3

void Llb_ImgSchedule(Vec_Ptr_t *vSupps,Vec_Ptr_t **pvQuant0,Vec_Ptr_t **pvQuant1,int fVerbose)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  
  iVar9 = vSupps->nSize;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar9 - 1U) {
    iVar11 = iVar9;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar11 * 8);
  }
  pVVar2->pArray = ppvVar3;
  *pvQuant0 = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar11 << 3);
  }
  pVVar2->pArray = ppvVar3;
  *pvQuant1 = pVVar2;
  if (0 < iVar9) {
    iVar9 = 0;
    do {
      pVVar2 = *pvQuant0;
      puVar4 = (undefined8 *)malloc(0x10);
      *puVar4 = 0x10;
      pvVar5 = malloc(0x40);
      puVar4[1] = pvVar5;
      uVar1 = pVVar2->nSize;
      if (uVar1 == pVVar2->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = 0x10;
        }
        else {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      iVar11 = pVVar2->nSize;
      pVVar2->nSize = iVar11 + 1;
      ppvVar3[iVar11] = puVar4;
      pVVar2 = *pvQuant1;
      puVar4 = (undefined8 *)malloc(0x10);
      *puVar4 = 0x10;
      pvVar5 = malloc(0x40);
      puVar4[1] = pvVar5;
      uVar1 = pVVar2->nSize;
      if (uVar1 == pVVar2->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = 0x10;
        }
        else {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      iVar11 = pVVar2->nSize;
      pVVar2->nSize = iVar11 + 1;
      ppvVar3[iVar11] = puVar4;
      iVar9 = iVar9 + 1;
    } while (iVar9 < vSupps->nSize);
    if (0 < vSupps->nSize) {
      lVar10 = (long)*(int *)((long)*vSupps->pArray + 4);
      if (0 < lVar10) {
        uVar6 = 0xffffffff;
        lVar8 = 0;
        do {
          if (0 < (long)vSupps->nSize) {
            uVar7 = 0;
            iVar9 = 0;
            do {
              if (*(int *)((long)vSupps->pArray[uVar7] + 4) <= lVar8) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              bVar12 = *(int *)(*(long *)((long)vSupps->pArray[uVar7] + 8) + lVar8 * 4) != 0;
              if (bVar12) {
                uVar6 = uVar7 & 0xffffffff;
              }
              iVar9 = iVar9 + (uint)bVar12;
              uVar7 = uVar7 + 1;
            } while ((long)vSupps->nSize != uVar7);
            if (iVar9 != 0) {
              iVar11 = (int)uVar6;
              if (iVar9 == 1) {
                if (iVar11 < 0) goto LAB_00840e70;
                pVVar2 = *pvQuant0;
              }
              else {
                if (iVar11 < 0) goto LAB_00840e70;
                pVVar2 = *pvQuant1;
              }
              if (pVVar2->nSize <= iVar11) goto LAB_00840e70;
              Vec_IntPush((Vec_Int_t *)pVVar2->pArray[uVar6],(int)lVar8);
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar10);
      }
      if ((fVerbose != 0) && (0 < vSupps->nSize)) {
        uVar6 = 0;
        do {
          printf("%2d : Quant0 = ",uVar6 & 0xffffffff);
          pVVar2 = *pvQuant0;
          if ((long)pVVar2->nSize <= (long)uVar6) goto LAB_00840e70;
          lVar10 = 0;
          while (lVar10 < *(int *)((long)pVVar2->pArray[uVar6] + 4)) {
            printf("%d ",(ulong)*(uint *)(*(long *)((long)pVVar2->pArray[uVar6] + 8) + lVar10 * 4));
            lVar10 = lVar10 + 1;
            pVVar2 = *pvQuant0;
            if ((long)pVVar2->nSize <= (long)uVar6) goto LAB_00840e70;
          }
          putchar(10);
          uVar6 = uVar6 + 1;
        } while ((long)uVar6 < (long)vSupps->nSize);
        if (0 < vSupps->nSize) {
          uVar6 = 0;
          do {
            printf("%2d : Quant1 = ",uVar6 & 0xffffffff);
            pVVar2 = *pvQuant1;
            if ((long)pVVar2->nSize <= (long)uVar6) goto LAB_00840e70;
            lVar10 = 0;
            while (lVar10 < *(int *)((long)pVVar2->pArray[uVar6] + 4)) {
              printf("%d ",(ulong)*(uint *)(*(long *)((long)pVVar2->pArray[uVar6] + 8) + lVar10 * 4)
                    );
              lVar10 = lVar10 + 1;
              pVVar2 = *pvQuant1;
              if ((long)pVVar2->nSize <= (long)uVar6) goto LAB_00840e70;
            }
            putchar(10);
            uVar6 = uVar6 + 1;
          } while ((long)uVar6 < (long)vSupps->nSize);
        }
      }
      return;
    }
  }
LAB_00840e70:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Llb_ImgSchedule( Vec_Ptr_t * vSupps, Vec_Ptr_t ** pvQuant0, Vec_Ptr_t ** pvQuant1, int fVerbose )
{
    Vec_Int_t * vOne;
    int nVarsAll, Counter, iSupp = -1, Entry, i, k;
    // start quantification arrays
    *pvQuant0 = Vec_PtrAlloc( Vec_PtrSize(vSupps) );
    *pvQuant1 = Vec_PtrAlloc( Vec_PtrSize(vSupps) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
    {
        Vec_PtrPush( *pvQuant0, Vec_IntAlloc(16) );
        Vec_PtrPush( *pvQuant1, Vec_IntAlloc(16) );
    }
    // count how many times each var appears
    nVarsAll = Vec_IntSize( (Vec_Int_t *)Vec_PtrEntry(vSupps, 0) );
    for ( i = 0; i < nVarsAll; i++ )
    {
        Counter = 0;
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            if ( Vec_IntEntry(vOne, i) )
            {
                iSupp = k;
                Counter++;
            }
        if ( Counter == 0 )
            continue;
        if ( Counter == 1 )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(*pvQuant0, iSupp), i );
        else // if ( Counter > 1 )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(*pvQuant1, iSupp), i );
    }

    if ( fVerbose )
    for ( i = 0; i < Vec_PtrSize(vSupps); i++ )
    {
        printf( "%2d : Quant0 = ", i );
        Vec_IntForEachEntry( (Vec_Int_t *)Vec_PtrEntry(*pvQuant0, i), Entry, k )
            printf( "%d ", Entry );
        printf( "\n" );
    }

    if ( fVerbose )
    for ( i = 0; i < Vec_PtrSize(vSupps); i++ )
    {
        printf( "%2d : Quant1 = ", i );
        Vec_IntForEachEntry( (Vec_Int_t *)Vec_PtrEntry(*pvQuant1, i), Entry, k )
            printf( "%d ", Entry );
        printf( "\n" );
    }
}